

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNMod::gen_code(CTPNMod *this,int discard,int for_condition)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  CTPNBin *unaff_retaddr;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  long lVar2;
  
  lVar2 = in_RDI;
  iVar1 = CTcPrsNodeBase::is_const_int
                    ((CTcPrsNodeBase *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RDI >> 0x20));
  if (iVar1 == 0) {
    iVar1 = CTcPrsNodeBase::is_const_int
                      ((CTcPrsNodeBase *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RDI >> 0x20));
    if (iVar1 == 0) {
      CTPNBin::gen_binary(unaff_retaddr,(uchar)((ulong)lVar2 >> 0x38),(int)lVar2,in_ESI);
    }
    else {
      (**(code **)**(undefined8 **)(in_RDI + 0x10))(*(undefined8 **)(in_RDI + 0x10),1);
      CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
      CTcGenTarg::note_push((CTcGenTarg *)0x2d3432);
    }
  }
  else {
    (**(code **)**(undefined8 **)(in_RDI + 8))(*(undefined8 **)(in_RDI + 8),in_ESI,in_EDX);
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    CTcGenTarg::note_push((CTcGenTarg *)0x2d33e5);
  }
  return;
}

Assistant:

void CTPNMod::gen_code(int discard, int for_condition)
{
    /* if dividing by 1, we can skip the whole thing (except side effects) */
    if (right_->is_const_int(1))
    {
        /* 
         *   simply generate the left side for side effects; actually
         *   doing the arithmetic has no effect 
         */
        left_->gen_code(discard, for_condition);

        /* the result is zero */
        G_cg->write_op(OPC_PUSH_0);
        G_cg->note_push();
        return;
    }

    /* if the left side is zero, the result is always zero */
    if (left_->is_const_int(0))
    {
        /* evaluate the right for side effects, but discard the result */
        right_->gen_code(TRUE, TRUE);

        /* the result is zero */
        G_cg->write_op(OPC_PUSH_0);
        G_cg->note_push();
        return;
    }

    /* use generic processing */
    gen_binary(OPC_MOD, discard, FALSE);
}